

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeHashDelete(Rtree *pRtree,RtreeNode *pNode)

{
  uint uVar1;
  RtreeNode **local_20;
  RtreeNode **pp;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  if (pNode->iNode != 0) {
    uVar1 = nodeHash(pNode->iNode);
    for (local_20 = pRtree->aHash + uVar1; *local_20 != pNode; local_20 = &(*local_20)->pNext) {
    }
    *local_20 = pNode->pNext;
    pNode->pNext = (RtreeNode *)0x0;
  }
  return;
}

Assistant:

static void nodeHashDelete(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode **pp;
  if( pNode->iNode!=0 ){
    pp = &pRtree->aHash[nodeHash(pNode->iNode)];
    for( ; (*pp)!=pNode; pp = &(*pp)->pNext){ assert(*pp); }
    *pp = pNode->pNext;
    pNode->pNext = 0;
  }
}